

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O2

bool __thiscall QFSFileEnginePrivate::nativeSyncToDisk(QFSFileEnginePrivate *this)

{
  QAbstractFileEngine *this_00;
  bool bVar1;
  int iVar2;
  int *piVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QAbstractFileEnginePrivate).q_ptr;
  do {
    iVar2 = nativeHandle(this);
    iVar2 = fdatasync(iVar2);
    if (iVar2 != -1) {
      if (iVar2 == 0) {
        bVar1 = true;
        goto LAB_0012c450;
      }
      piVar3 = __errno_location();
      break;
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  qt_error_string((QString *)&local_30,*piVar3);
  QAbstractFileEngine::setError(this_00,WriteError,(QString *)&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  bVar1 = false;
LAB_0012c450:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QFSFileEnginePrivate::nativeSyncToDisk()
{
    Q_Q(QFSFileEngine);
    int ret;
#if defined(_POSIX_SYNCHRONIZED_IO) && _POSIX_SYNCHRONIZED_IO > 0
    QT_EINTR_LOOP(ret, fdatasync(nativeHandle()));
#else
    QT_EINTR_LOOP(ret, fsync(nativeHandle()));
#endif
    if (ret != 0)
        q->setError(QFile::WriteError, qt_error_string(errno));
    return ret == 0;
}